

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_client.h
# Opt level: O1

int __thiscall
blcl::net::client_interface<MsgType>::connect
          (client_interface<MsgType> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  io_context *context;
  char *pcVar1;
  size_t sVar2;
  connection<MsgType> *pcVar3;
  connection<MsgType> *this_00;
  uint __val;
  undefined4 in_register_00000034;
  uint __len_00;
  string_view service;
  string_view host;
  string __str;
  results_type endpoints;
  resolver resolver;
  undefined1 local_138 [8];
  id *piStack_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [4];
  results_type local_e0;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  local_c8;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_78;
  
  context = &this->context_;
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&local_78,0,0,context);
  __val = (uint)__addr & 0xffff;
  __len_00 = 1;
  if (((9 < (ushort)__addr) && (__len_00 = 2, 99 < (ushort)__addr)) && (__len_00 = 3, 999 < __val))
  {
    __len_00 = 5 - (__val < 10000);
  }
  pcVar1 = *(char **)CONCAT44(in_register_00000034,__fd);
  sVar2 = ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
  local_138 = (undefined1  [8])local_128;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
             (ulong)__len_00,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_138,__len_00,__val);
  service._M_str = (char *)local_138;
  service._M_len = (size_t)piStack_130;
  host._M_str = pcVar1;
  host._M_len = sVar2;
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            (&local_e0,(basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)&local_78,host,
             service,0);
  if (local_138 != (undefined1  [8])local_128) {
    operator_delete((void *)local_138,local_128[0]._M_allocated_capacity + 1);
  }
  local_138 = (undefined1  [8])
              &asio::detail::typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::tcp>>::
               typeinfo;
  piStack_130 = (id *)0x0;
  local_c8.service_ =
       (service_type *)
       asio::detail::service_registry::do_use_service
                 ((context->super_execution_context).service_registry_,(key *)local_138,
                  asio::detail::service_registry::
                  create<asio::detail::reactive_socket_service<asio::ip::tcp>,asio::io_context>,
                  context);
  local_c8.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_ = &local_c8.executor_;
  local_c8.implementation_.protocol_.family_ = 2;
  local_c8.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_fns_ =
       (target_fns *)
       asio::execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
       ::fns_with_execute;
  local_c8.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_fns_ =
       (object_fns *)
       asio::execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
       ::fns;
  local_c8.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_._12_4_ = 0;
  local_c8.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .prop_fns_ = (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)asio::execution::
                  any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
                  ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>()
                  ::fns;
  local_c8.implementation_.super_base_implementation_type.socket_ = -1;
  local_c8.implementation_.super_base_implementation_type.state_ = '\0';
  local_c8.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_.__align = (anon_struct_8_0_00000001_for___align)context;
  this_00 = (connection<MsgType> *)operator_new(0x198);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                  *)local_138,&local_c8);
  connection<MsgType>::connection
            (this_00,client,context,(socket *)local_138,&this->incoming_messages_);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                   *)local_138);
  pcVar3 = (this->connection_)._M_t.
           super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
           .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl;
  (this->connection_)._M_t.
  super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
  .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl = this_00;
  if (pcVar3 != (connection<MsgType> *)0x0) {
    (*pcVar3->_vptr_connection[1])();
  }
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&local_c8);
  connection<MsgType>::connect_to_server
            ((this->connection_)._M_t.
             super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
             .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl,&local_e0)
  ;
  local_c8.service_ = (service_type *)this;
  std::thread::
  thread<blcl::net::client_interface<MsgType>::connect(std::__cxx11::string_const&,unsigned_short)::_lambda()_1_,,void>
            ((thread *)local_138,(anon_class_8_1_8991fb9c_for__M_head_impl *)&local_c8);
  if ((this->ctx_thread_)._M_id._M_thread == 0) {
    (this->ctx_thread_)._M_id._M_thread = (native_handle_type)local_138;
    if (local_e0.super_basic_resolver_iterator<asio::ip::tcp>.values_.
        super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super_basic_resolver_iterator<asio::ip::tcp>.values_.
                 super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    asio::detail::
    io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
    ~io_object_impl(&local_78);
    return 0;
  }
  std::terminate();
}

Assistant:

bool connect(const std::string& host, const uint16_t port) {
            try {
                asio::ip::tcp::resolver resolver(context_);
                auto endpoints = resolver.resolve(host, std::to_string(port));

                connection_ = std::make_unique<connection<T>>(
                        connection<T>::owner::client, context_, asio::ip::tcp::socket(context_), incoming_messages_);
                connection_->connect_to_server(endpoints);
                ctx_thread_ = std::thread([this]() { context_.run(); });
            } catch (std::exception& e) {
                std::cerr << "Client exception: " << e.what() << '\n';
                return false;
            }

            return false;
        }